

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

void Abc_TtImplementNpnConfig(word *pTruth,int nVars,char *pCanonPerm,uint uCanonPhase)

{
  char cVar1;
  int nWords_00;
  int t;
  int nWords;
  int k;
  int i;
  uint uCanonPhase_local;
  char *pCanonPerm_local;
  int nVars_local;
  word *pTruth_local;
  
  nWords_00 = Abc_TtWordNum(nVars);
  if ((uCanonPhase >> ((byte)nVars & 0x1f) & 1) != 0) {
    Abc_TtNot(pTruth,nWords_00);
  }
  for (nWords = 0; nWords < nVars; nWords = nWords + 1) {
    if ((uCanonPhase >> ((byte)nWords & 0x1f) & 1) != 0) {
      Abc_TtFlip(pTruth,nWords_00,nWords);
    }
  }
  if (pCanonPerm != (char *)0x0) {
    for (nWords = 0; nWords < nVars; nWords = nWords + 1) {
      t = nWords;
      while ((t < nVars && (pCanonPerm[t] != nWords))) {
        t = t + 1;
      }
      if (nVars <= t) {
        __assert_fail("k < nVars",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                      ,0x787,"void Abc_TtImplementNpnConfig(word *, int, char *, unsigned int)");
      }
      if (nWords != t) {
        Abc_TtSwapVars(pTruth,nVars,nWords,t);
        cVar1 = pCanonPerm[nWords];
        pCanonPerm[nWords] = pCanonPerm[t];
        pCanonPerm[t] = cVar1;
      }
    }
  }
  return;
}

Assistant:

static inline void Abc_TtImplementNpnConfig( word * pTruth, int nVars, char * pCanonPerm, unsigned uCanonPhase )
{
    int i, k, nWords = Abc_TtWordNum( nVars );
    if ( (uCanonPhase >> nVars) & 1 )
        Abc_TtNot( pTruth, nWords );
    for ( i = 0; i < nVars; i++ )
        if ( (uCanonPhase >> i) & 1 )
            Abc_TtFlip( pTruth, nWords, i );
    if ( pCanonPerm )
    for ( i = 0; i < nVars; i++ )
    {
        for ( k = i; k < nVars; k++ )
            if ( pCanonPerm[k] == i )
                break;
        assert( k < nVars );
        if ( i == k )
            continue;
        Abc_TtSwapVars( pTruth, nVars, i, k );
        ABC_SWAP( int, pCanonPerm[i], pCanonPerm[k] );
    }
}